

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * sqlite3WindowOffsetExpr(Parse *pParse,Expr *pExpr)

{
  int iVar1;
  Expr *pEVar2;
  
  iVar1 = sqlite3ExprIsConstant(pExpr);
  if (iVar1 != 0) {
    return pExpr;
  }
  if (1 < pParse->eParseMode) {
    sqlite3RenameExprUnmap(pParse,pExpr);
  }
  sqlite3ExprDelete(pParse->db,pExpr);
  pEVar2 = sqlite3ExprAlloc(pParse->db,0x72,(Token *)0x0,0);
  return pEVar2;
}

Assistant:

static Expr *sqlite3WindowOffsetExpr(Parse *pParse, Expr *pExpr){
  if( 0==sqlite3ExprIsConstant(pExpr) ){
    if( IN_RENAME_OBJECT ) sqlite3RenameExprUnmap(pParse, pExpr);
    sqlite3ExprDelete(pParse->db, pExpr);
    pExpr = sqlite3ExprAlloc(pParse->db, TK_NULL, 0, 0);
  }
  return pExpr;
}